

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

ZCC_Expression * __thiscall ZCCCompiler::SimplifyUnary(ZCCCompiler *this,ZCC_ExprUnary *unary)

{
  ZCC_Expression *pZVar1;
  ZCC_OpProto *pZVar2;
  ZCC_OpProto *op;
  ZCC_ExprUnary *unary_local;
  ZCCCompiler *this_local;
  
  pZVar1 = Simplify(this,unary->Operand);
  unary->Operand = pZVar1;
  pZVar2 = PromoteUnary(this,(unary->super_ZCC_Expression).Operation,&unary->Operand);
  this_local = (ZCCCompiler *)unary;
  if (pZVar2 == (ZCC_OpProto *)0x0) {
    (unary->super_ZCC_Expression).Type = &TypeError->super_PType;
  }
  else if (unary->Operand->Operation == PEX_ConstValue) {
    this_local = (ZCCCompiler *)(*(pZVar2->field_4).EvalConst1)((ZCC_ExprConstant *)unary->Operand);
  }
  return (ZCC_Expression *)this_local;
}

Assistant:

ZCC_Expression *ZCCCompiler::SimplifyUnary(ZCC_ExprUnary *unary)
{
	unary->Operand = Simplify(unary->Operand);
	ZCC_OpProto *op = PromoteUnary(unary->Operation, unary->Operand);
	if (op == NULL)
	{ // Oh, poo!
		unary->Type = TypeError;
	}
	else if (unary->Operand->Operation == PEX_ConstValue)
	{
		return op->EvalConst1(static_cast<ZCC_ExprConstant *>(unary->Operand));
	}
	return unary;
}